

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# var_float.c
# Opt level: O0

int vf_profile_equal(vf_profile_t lhs,vf_profile_t rhs)

{
  long in_stack_00000008;
  int mnt_mask_equal;
  int exp_mask_equal;
  int sgn_mask_equal;
  int mnt_bits_equal;
  int exp_bits_equal;
  int sgn_bits_equal;
  int bits_equal;
  int bias_equal;
  
  return (uint)(((((((lhs.mnt_mask == rhs.mnt_mask && (short)lhs.mask == (short)rhs.mask) &&
                    lhs.mask._2_2_ == rhs.mask._2_2_) && lhs.mask._4_2_ == rhs.mask._4_2_) &&
                  lhs.mask._6_2_ == rhs.mask._6_2_) && in_stack_00000008 == lhs._40_8_) &&
                lhs.sgn_mask == rhs.sgn_mask) && lhs.exp_mask == rhs.exp_mask);
}

Assistant:

int vf_profile_equal(vf_profile_t lhs, vf_profile_t rhs) {
	int bias_equal = lhs.bias == rhs.bias;
	int bits_equal = lhs.bits == rhs.bits;
	int sgn_bits_equal = lhs.sgn_bits == rhs.sgn_bits;
	int exp_bits_equal = lhs.exp_bits == rhs.exp_bits;
	int mnt_bits_equal = lhs.mnt_bits == rhs.mnt_bits;
	int sgn_mask_equal = lhs.sgn_mask == rhs.sgn_mask;
	int exp_mask_equal = lhs.exp_mask == rhs.exp_mask;
	int mnt_mask_equal = lhs.mnt_mask == rhs.mnt_mask;
	return bias_equal & bits_equal & sgn_bits_equal & exp_bits_equal & mnt_bits_equal & sgn_mask_equal & exp_mask_equal & mnt_mask_equal;
}